

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O0

RadialGradientShape __thiscall
Rml::DecoratorRadialGradient::CalculateRadialGradientShape
          (DecoratorRadialGradient *this,Element *element,Vector2f dimensions)

{
  RadialGradientShape RVar1;
  float fVar2;
  float fVar3;
  Vector2f VVar4;
  float local_17c;
  Vector2f local_168;
  Vector2f local_160;
  Vector2f local_150;
  Vector2f local_148;
  NumericValue local_140;
  NumericValue local_138;
  Vector2f local_130;
  Vector2f local_128;
  Vector2f local_120;
  Vector2<float> local_118;
  Vector2f local_110;
  Vector2<float> local_108;
  Vector2f local_100;
  Vector2f local_f8;
  Vector2f local_f0;
  Vector2f local_e8;
  Vector2<float> local_e0;
  Vector2f local_d8;
  Vector2f local_d0;
  Vector2f local_c8;
  Vector2f local_c0;
  Vector2f local_b8;
  Vector2<float> local_b0;
  Vector2f local_a8;
  Vector2f local_a0;
  Vector2f local_98;
  Vector2f local_90;
  Vector2f local_88;
  Vector2<float> local_80;
  Vector2f local_78;
  Vector2f local_70;
  Vector2f local_68;
  Vector2f local_60;
  Vector2f r;
  Vector2f c;
  Vector2f d;
  anon_class_1_0_00000001 Abs;
  bool is_circle;
  Element *element_local;
  DecoratorRadialGradient *this_local;
  Vector2f dimensions_local;
  RadialGradientShape result;
  
  RadialGradientShape::RadialGradientShape((RadialGradientShape *)&dimensions_local);
  this_local._0_4_ = dimensions.x;
  dimensions_local.x = Element::ResolveNumericValue(element,(this->position).x,this_local._0_4_);
  this_local._4_4_ = dimensions.y;
  dimensions_local.y = Element::ResolveNumericValue(element,(this->position).y,this_local._4_4_);
  d.y._3_1_ = this->shape == Circle;
  r.y = dimensions_local.y;
  r.x = dimensions_local.x;
  c = dimensions;
  Vector2<float>::Vector2(&local_60);
  switch(this->size_type) {
  case ClosestSide:
    local_78 = r;
    local_88 = r;
    local_80 = Vector2<float>::operator-(&c,r);
    local_70 = Math::Min<Rml::Vector2<float>>(local_78,local_80);
    local_68 = CalculateRadialGradientShape::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)((long)&d.y + 2),local_70);
    VVar4 = local_68;
    local_60 = local_68;
    if ((d.y._3_1_ & 1) != 0) {
      local_60.x = local_68.x;
      local_60.y = local_68.y;
      fVar3 = local_60.x;
      fVar2 = local_60.y;
      fVar3 = Math::Min<float>(fVar3,fVar2);
      Vector2<float>::Vector2(&local_90,fVar3);
      VVar4 = local_90;
    }
    local_90 = VVar4;
    result.center.x = local_90.x;
    result.center.y = local_90.y;
    break;
  case FarthestSide:
    local_a8 = r;
    local_b8 = r;
    local_b0 = Vector2<float>::operator-(&c,r);
    local_a0 = Math::Max<Rml::Vector2<float>>(local_a8,local_b0);
    local_98 = CalculateRadialGradientShape::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)((long)&d.y + 2),local_a0);
    VVar4 = local_98;
    local_60 = local_98;
    if ((d.y._3_1_ & 1) != 0) {
      local_60.x = local_98.x;
      local_60.y = local_98.y;
      fVar3 = local_60.x;
      fVar2 = local_60.y;
      fVar3 = Math::Max<float>(fVar3,fVar2);
      Vector2<float>::Vector2(&local_c0,fVar3);
      VVar4 = local_c0;
    }
    local_c0 = VVar4;
    result.center.x = local_c0.x;
    result.center.y = local_c0.y;
    break;
  case ClosestCorner:
  case FarthestCorner:
    if (this->size_type == ClosestCorner) {
      local_d8 = r;
      local_e8 = r;
      local_e0 = Vector2<float>::operator-(&c,r);
      local_d0 = Math::Min<Rml::Vector2<float>>(local_d8,local_e0);
      local_c8 = CalculateRadialGradientShape::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)((long)&d.y + 2),local_d0);
      local_60 = local_c8;
    }
    else {
      local_100 = r;
      local_110 = r;
      local_108 = Vector2<float>::operator-(&c,r);
      local_f8 = Math::Max<Rml::Vector2<float>>(local_100,local_108);
      local_f0 = CalculateRadialGradientShape::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)((long)&d.y + 2),local_f8);
      local_60 = local_f0;
    }
    if ((d.y._3_1_ & 1) == 0) {
      local_128 = local_60;
      Vector2<float>::Vector2(&local_130,1.0);
      local_120 = Math::Max<Rml::Vector2<float>>(local_128,local_130);
      local_60.x = local_120.x;
      fVar3 = local_60.x * 2.0 * local_60.x;
      local_60 = local_120;
      result.center.x = Math::SquareRoot(fVar3);
      result.center.y = result.center.x * (local_60.y / local_60.x);
    }
    else {
      fVar3 = Vector2<float>::Magnitude(&local_60);
      Vector2<float>::Vector2(&local_118,fVar3);
      result.center.x = local_118.x;
      result.center.y = local_118.y;
    }
    break;
  case LengthPercentage:
    local_138 = (this->size).x;
    fVar3 = Element::ResolveNumericValue(element,local_138,c.x);
    local_17c = fVar3;
    if ((d.y._3_1_ & 1) == 0) {
      local_140 = (this->size).y;
      local_17c = Element::ResolveNumericValue(element,local_140,c.y);
    }
    local_150.y = local_17c;
    local_150.x = fVar3;
    local_148 = CalculateRadialGradientShape::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&d.y + 2),local_150);
    result.center.x = local_148.x;
    result.center.y = local_148.y;
  }
  local_160.y = result.center.y;
  local_160.x = result.center.x;
  Vector2<float>::Vector2(&local_168,1.0);
  VVar4 = Math::Max<Rml::Vector2<float>>(local_160,local_168);
  result.center.x = VVar4.x;
  result.center.y = VVar4.y;
  RVar1.center.y = dimensions_local.y;
  RVar1.center.x = dimensions_local.x;
  RVar1.radius.x = result.center.x;
  RVar1.radius.y = result.center.y;
  return RVar1;
}

Assistant:

DecoratorRadialGradient::RadialGradientShape DecoratorRadialGradient::CalculateRadialGradientShape(Element* element, Vector2f dimensions) const
{
	RadialGradientShape result;
	result.center.x = element->ResolveNumericValue(position.x, dimensions.x);
	result.center.y = element->ResolveNumericValue(position.y, dimensions.y);
	const bool is_circle = (shape == Shape::Circle);

	auto Abs = [](Vector2f v) { return Vector2f{Math::Absolute(v.x), Math::Absolute(v.y)}; };
	auto d = dimensions;
	auto c = result.center;
	Vector2f r;

	switch (size_type)
	{
	case SizeType::ClosestSide:
	{
		r = Abs(Math::Min(c, d - c));
		result.radius = (is_circle ? Vector2f(Math::Min(r.x, r.y)) : r);
	}
	break;
	case SizeType::FarthestSide:
	{
		r = Abs(Math::Max(c, d - c));
		result.radius = (is_circle ? Vector2f(Math::Max(r.x, r.y)) : r);
	}
	break;
	case SizeType::ClosestCorner:
	case SizeType::FarthestCorner:
	{
		if (size_type == SizeType::ClosestCorner)
			r = Abs(Math::Min(c, d - c)); // Same as closest-side.
		else
			r = Abs(Math::Max(c, d - c)); // Same as farthest-side.

		if (is_circle)
		{
			result.radius = Vector2f(r.Magnitude());
		}
		else
		{
			r = Math::Max(r, Vector2f(1)); // In case r.x ~= 0
			result.radius.x = Math::SquareRoot(2.f * r.x * r.x);
			result.radius.y = result.radius.x * (r.y / r.x);
		}
	}
	break;
	case SizeType::LengthPercentage:
	{
		result.radius.x = element->ResolveNumericValue(size.x, d.x);
		result.radius.y = (is_circle ? result.radius.x : element->ResolveNumericValue(size.y, d.y));
		result.radius = Abs(result.radius);
	}
	break;
	}

	result.radius = Math::Max(result.radius, Vector2f(1.f));
	return result;
}